

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbersfromtextfiles.h
# Opt level: O0

uint32_t ** read_all_integer_files(char *dirname,char *extension,size_t **howmany,size_t *count)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  uint32_t **howmany_00;
  char *__dest;
  uint32_t *puVar4;
  long *in_RCX;
  undefined8 *in_RDX;
  char *in_RDI;
  int i_2;
  char *fullpath;
  size_t filelen;
  size_t pos;
  size_t i_1;
  char *modifdirname;
  size_t dirlen;
  uint32_t **answer;
  int i;
  size_t truec;
  int c;
  dirent **entry_list;
  int local_84;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *filename;
  ulong local_68;
  char *local_60;
  size_t local_58;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  long local_40;
  dirent **local_30;
  long *local_28;
  undefined8 *local_20;
  char *local_10;
  uint32_t **local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  iVar2 = scandir(in_RDI,&local_30,(__selector *)0x0,alphasort);
  if (iVar2 < 0) {
    local_8 = (uint32_t **)0x0;
  }
  else {
    local_40 = 0;
    for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
      _Var1 = hasExtension(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (_Var1) {
        local_40 = local_40 + 1;
      }
    }
    *local_28 = local_40;
    pvVar3 = malloc(*local_28 << 3);
    *local_20 = pvVar3;
    howmany_00 = (uint32_t **)malloc(*local_28 << 3);
    local_58 = strlen(local_10);
    local_60 = local_10;
    if (local_10[local_58 - 1] != '/') {
      local_60 = (char *)malloc(local_58 + 2);
      strcpy(local_60,local_10);
      local_60[local_58] = '/';
      local_60[local_58 + 1] = '\0';
      local_58 = local_58 + 1;
    }
    filename = (char *)0x0;
    for (local_68 = 0; local_68 < (ulong)(long)iVar2; local_68 = local_68 + 1) {
      _Var1 = hasExtension(filename,in_stack_ffffffffffffff88);
      if (_Var1) {
        in_stack_ffffffffffffff88 = (char *)strlen(local_30[local_68]->d_name);
        __dest = (char *)malloc((size_t)(in_stack_ffffffffffffff88 + local_58 + 1));
        strcpy(__dest,local_60);
        strcpy(__dest + local_58,local_30[local_68]->d_name);
        puVar4 = read_integer_file((char *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                                   (size_t *)howmany_00);
        howmany_00[(long)filename] = puVar4;
        filename = filename + 1;
        free(__dest);
      }
    }
    if (local_60 != local_10) {
      free(local_60);
    }
    for (local_84 = 0; local_84 < iVar2; local_84 = local_84 + 1) {
      free(local_30[local_84]);
    }
    free(local_30);
    local_8 = howmany_00;
  }
  return local_8;
}

Assistant:

static uint32_t **read_all_integer_files(const char *dirname,
                                         const char *extension,
                                         size_t **howmany, size_t *count) {
    struct dirent **entry_list;

    int c = scandir(dirname, &entry_list, 0, alphasort);
    if (c < 0) return NULL;
    size_t truec = 0;
    for (int i = 0; i < c; i++) {
        if (hasExtension(entry_list[i]->d_name, extension)) ++truec;
    }
    *count = truec;
    *howmany = (size_t *)malloc(sizeof(size_t) * (*count));
    uint32_t **answer = (uint32_t **)malloc(sizeof(uint32_t *) * (*count));
    size_t dirlen = strlen(dirname);
    char *modifdirname = (char *)dirname;
    if (modifdirname[dirlen - 1] != '/') {
        modifdirname = (char *)malloc(dirlen + 2);
        strcpy(modifdirname, dirname);
        modifdirname[dirlen] = '/';
        modifdirname[dirlen + 1] = '\0';
        dirlen++;
    }
    for (size_t i = 0, pos = 0; i < (size_t)c;
         i++) { /* formerly looped while i < *count */
        if (!hasExtension(entry_list[i]->d_name, extension)) continue;
        size_t filelen = strlen(entry_list[i]->d_name);
        char *fullpath = (char *)malloc(dirlen + filelen + 1);
        strcpy(fullpath, modifdirname);
        strcpy(fullpath + dirlen, entry_list[i]->d_name);
        answer[pos] = read_integer_file(fullpath, &((*howmany)[pos]));
        pos++;
        free(fullpath);
    }
    if (modifdirname != dirname) {
        free(modifdirname);
    }
    for (int i = 0; i < c; ++i) free(entry_list[i]);
    free(entry_list);
    return answer;
}